

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

int __thiscall Parse::paramList(Parse *this)

{
  DelimiterTable *pDVar1;
  int iVar2;
  reference pvVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  bool bVar6;
  allocator local_41;
  key_type local_40;
  int local_1c;
  Parse *pPStack_18;
  int index;
  Parse *this_local;
  
  local_1c = this->curIndex;
  pPStack_18 = this;
  iVar2 = param(this);
  if (iVar2 == 0) {
    this->curIndex = local_1c;
    this_local._4_4_ = 0;
  }
  else {
    this->paraNum = this->paraNum + 1;
    pvVar3 = std::vector<Token,_std::allocator<Token>_>::operator[]
                       (this->tokenVec,(long)this->curIndex);
    bVar6 = false;
    if (pvVar3->type == DELIMTER) {
      pDVar1 = this->delimiterTable;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_40,",",&local_41);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&(pDVar1->
                             super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ).index,&local_40);
      iVar2 = *pmVar4;
      pvVar3 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      bVar6 = iVar2 == pvVar3->id;
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    if (bVar6) {
      this->curIndex = this->curIndex + 1;
      iVar2 = paramList(this);
      if (iVar2 == 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_21948);
        pvVar3 = std::vector<Token,_std::allocator<Token>_>::operator[]
                           (this->tokenVec,(long)local_1c);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar3->line);
        poVar5 = std::operator<<(poVar5,anon_var_dwarf_21954);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        exit(0);
      }
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Parse::paramList() {
    int index = curIndex;
    if(!param()) {
        curIndex = index;
        return 0;
    }
    paraNum++;
    if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index[","] == tokenVec[curIndex].id) {
        curIndex++;
        if(!paramList()) {
            cout << "在" << tokenVec[index].line << "行缺少形式参数声明" << endl;
            exit(0);
        }
    }
    return 1;
}